

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfilesystemengine_unix.cpp
# Opt level: O2

void __thiscall QFileSystemMetaData::fillFromStatBuf(QFileSystemMetaData *this,stat64 *statBuffer)

{
  __gid_t _Var1;
  MetaDataFlags MVar2;
  uint uVar3;
  
  MVar2 = flagsFromStMode(statBuffer->st_mode,(quint64)statBuffer);
  uVar3 = (this->entryFlags).super_QFlagsStorageHelper<QFileSystemMetaData::MetaDataFlag,_4>.
          super_QFlagsStorage<QFileSystemMetaData::MetaDataFlag>.i |
          (uint)MVar2.super_QFlagsStorageHelper<QFileSystemMetaData::MetaDataFlag,_4>.
                super_QFlagsStorage<QFileSystemMetaData::MetaDataFlag>.i;
  (this->entryFlags).super_QFlagsStorageHelper<QFileSystemMetaData::MetaDataFlag,_4>.
  super_QFlagsStorage<QFileSystemMetaData::MetaDataFlag>.i = uVar3;
  (this->knownFlagsMask).super_QFlagsStorageHelper<QFileSystemMetaData::MetaDataFlag,_4>.
  super_QFlagsStorage<QFileSystemMetaData::MetaDataFlag>.i =
       (uint)MVar2.super_QFlagsStorageHelper<QFileSystemMetaData::MetaDataFlag,_4>.
             super_QFlagsStorage<QFileSystemMetaData::MetaDataFlag>.i |
       (this->knownFlagsMask).super_QFlagsStorageHelper<QFileSystemMetaData::MetaDataFlag,_4>.
       super_QFlagsStorage<QFileSystemMetaData::MetaDataFlag>.i | 0x72a67077;
  if (statBuffer->st_nlink == 0) {
    (this->entryFlags).super_QFlagsStorageHelper<QFileSystemMetaData::MetaDataFlag,_4>.
    super_QFlagsStorage<QFileSystemMetaData::MetaDataFlag>.i = uVar3 | 0x40000000;
  }
  this->size_ = statBuffer->st_size;
  this->accessTime_ =
       ((statBuffer->st_atim).tv_sec * 1000000000 + (statBuffer->st_atim).tv_nsec) / 1000000;
  this->birthTime_ = 0;
  this->metadataChangeTime_ =
       ((statBuffer->st_ctim).tv_sec * 1000000000 + (statBuffer->st_ctim).tv_nsec) / 1000000;
  this->modificationTime_ =
       ((statBuffer->st_mtim).tv_sec * 1000000000 + (statBuffer->st_mtim).tv_nsec) / 1000000;
  _Var1 = statBuffer->st_gid;
  this->userId_ = statBuffer->st_uid;
  this->groupId_ = _Var1;
  return;
}

Assistant:

void QFileSystemMetaData::fillFromStatBuf(const QT_STATBUF &statBuffer)
{
    quint64 attributes = 0;
#if defined(UF_SETTABLE)        // BSDs (incl. Darwin)
    attributes = statBuffer.st_flags;
#elif defined(Q_OS_VXWORKS) && __has_include(<dosFsLib.h>)
    attributes = statBuffer.st_attrib;
#endif
    // Permissions
    MetaDataFlags flags = flagsFromStMode(statBuffer.st_mode, attributes);
    entryFlags |= flags;
    knownFlagsMask |= flags | PosixStatFlags;

    // Attributes
    if (statBuffer.st_nlink == 0)
        entryFlags |= QFileSystemMetaData::WasDeletedAttribute;
    size_ = statBuffer.st_size;

    // Times
    accessTime_ = GetFileTimes::atime(statBuffer, 0);
    birthTime_ = GetFileTimes::birthtime(statBuffer, 0);
    metadataChangeTime_ = GetFileTimes::ctime(statBuffer, 0);
    modificationTime_ = GetFileTimes::mtime(statBuffer, 0);

    userId_ = statBuffer.st_uid;
    groupId_ = statBuffer.st_gid;
}